

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex_tests.cpp
# Opt level: O0

void __thiscall
coinstatsindex_tests::coinstatsindex_unclean_shutdown::test_method
          (coinstatsindex_unclean_shutdown *this)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> b;
  undefined1 uVar2;
  undefined1 uVar3;
  bool bVar4;
  undefined1 uVar5;
  lazy_ostream *plVar6;
  lazy_ostream *plVar7;
  long in_FS_OFFSET;
  CoinStatsIndex *in_stack_ffffffffffffef68;
  basic_cstring<const_char> *v;
  undefined4 in_stack_ffffffffffffef70;
  undefined4 in_stack_ffffffffffffef74;
  undefined4 in_stack_ffffffffffffef78;
  ChainstateRole in_stack_ffffffffffffef7c;
  Chainstate *in_stack_ffffffffffffef88;
  undefined7 in_stack_ffffffffffffef90;
  undefined1 in_stack_ffffffffffffef97;
  CBlock *in_stack_ffffffffffffef98;
  ChainstateManager *pCVar8;
  undefined7 in_stack_ffffffffffffefa0;
  undefined1 in_stack_ffffffffffffefa7;
  undefined7 in_stack_ffffffffffffefa8;
  undefined1 in_stack_ffffffffffffefaf;
  undefined7 in_stack_ffffffffffffefb0;
  undefined1 in_stack_ffffffffffffefb7;
  CCoinsViewCache *in_stack_ffffffffffffefb8;
  undefined1 in_stack_ffffffffffffefce;
  undefined1 in_stack_ffffffffffffefcf;
  size_t in_stack_ffffffffffffefd0;
  Chainstate *chainstate_00;
  CScript *in_stack_fffffffffffff008;
  undefined7 in_stack_fffffffffffff010;
  undefined1 in_stack_fffffffffffff017;
  TestChain100Setup *in_stack_fffffffffffff018;
  undefined7 in_stack_fffffffffffff020;
  undefined1 in_stack_fffffffffffff027;
  undefined4 in_stack_fffffffffffff078;
  undefined4 in_stack_fffffffffffff07c;
  ChainstateManager *state_00;
  undefined7 in_stack_fffffffffffff088;
  undefined7 in_stack_fffffffffffff098;
  CChainParams *params;
  Chainstate *chainstate;
  coinstatsindex_unclean_shutdown *this_local;
  const_string local_f18;
  lazy_ostream local_ef8 [2];
  assertion_result local_ed8 [2];
  const_string local_ea0 [2];
  lazy_ostream local_e80 [2];
  assertion_result local_e60 [2];
  bool *in_stack_fffffffffffff1d0;
  const_string local_e20 [2];
  lazy_ostream local_e00 [2];
  assertion_result local_de0 [2];
  const_string local_da8 [2];
  lazy_ostream local_d88 [2];
  assertion_result local_d68 [2];
  const_string local_d30 [2];
  lazy_ostream local_d10 [2];
  assertion_result local_cf0 [3];
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  CBlockIndex *new_block_index;
  shared_ptr<const_CBlock> new_block;
  const_string local_c50 [2];
  lazy_ostream local_c30 [2];
  assertion_result local_c10 [2];
  const_string local_bd8 [2];
  lazy_ostream local_bb8 [2];
  assertion_result local_b98 [2];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  CoinStatsIndex index_1;
  CCoinsViewCache view;
  BlockValidationState state;
  CBlock block;
  CScript script_pub_key;
  CoinStatsIndex index;
  
  chainstate_00 = (Chainstate *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             CONCAT17(in_stack_ffffffffffffefaf,in_stack_ffffffffffffefa8),
             (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
             (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
             (char *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90),
             (char *)in_stack_ffffffffffffef88);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffef68);
  ChainstateManager::ActiveChainstate
            ((ChainstateManager *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78));
  Params();
  interfaces::MakeChain
            ((NodeContext *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78));
  CoinStatsIndex::CoinStatsIndex
            ((CoinStatsIndex *)CONCAT17(in_stack_ffffffffffffefaf,in_stack_ffffffffffffefa8),
             (unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),in_stack_ffffffffffffefd0
             ,(bool)in_stack_ffffffffffffefcf,(bool)in_stack_ffffffffffffefce);
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::~unique_ptr
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78));
  do {
    pCVar8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefaf,in_stack_ffffffffffffefa8),
               (const_string *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
               (size_t)in_stack_ffffffffffffef98,
               (const_string *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90));
    uVar2 = BaseIndex::Init((BaseIndex *)
                            CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               SUB41((uint)in_stack_ffffffffffffef74 >> 0x18,0));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    in_stack_ffffffffffffef68 = (CoinStatsIndex *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b98,local_bb8,local_bd8,0x57,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef68);
    uVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar3);
  do {
    state_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefaf,in_stack_ffffffffffffefa8),
               (const_string *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
               (size_t)in_stack_ffffffffffffef98,
               (const_string *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90));
    bVar4 = BaseIndex::StartBackgroundSync
                      ((BaseIndex *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90));
    in_stack_fffffffffffff07c = CONCAT13(bVar4,(int3)in_stack_fffffffffffff07c);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               SUB41((uint)in_stack_ffffffffffffef74 >> 0x18,0));
    plVar7 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    in_stack_ffffffffffffef68 = (CoinStatsIndex *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c10,local_c30,local_c50,0x58,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef68);
    bVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar4);
  inline_assertion_check<true,util::SignalInterrupt*&>
            ((SignalInterrupt **)CONCAT17(in_stack_ffffffffffffefaf,in_stack_ffffffffffffefa8),
             (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
             (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
             (char *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90),
             (char *)in_stack_ffffffffffffef88);
  IndexWaitSynced(&in_stack_ffffffffffffef68->super_BaseIndex,(SignalInterrupt *)0x54e311);
  std::shared_ptr<const_CBlock>::shared_ptr((shared_ptr<const_CBlock> *)in_stack_ffffffffffffef68);
  new_block_index = (CBlockIndex *)0x0;
  CScript::CScript((CScript *)in_stack_ffffffffffffef68);
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90));
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffefaf,in_stack_ffffffffffffefa8));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70));
  b._M_ptr._7_1_ = in_stack_ffffffffffffefa7;
  b._M_ptr._0_7_ = in_stack_ffffffffffffefa0;
  b._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffefa8;
  b._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffefaf;
  CScript::operator<<((CScript *)in_stack_ffffffffffffef88,b);
  CScript::operator<<((CScript *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                      (opcodetype)((ulong)in_stack_ffffffffffffef98 >> 0x20));
  CScript::CScript((CScript *)in_stack_ffffffffffffef68,(CScript *)0x54e3ee);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78));
  CScript::~CScript((CScript *)in_stack_ffffffffffffef68);
  local_ca8 = 0;
  uStack_ca0 = 0;
  local_c98 = 0;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_ffffffffffffef68);
  TestChain100Setup::CreateBlock
            (in_stack_fffffffffffff018,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010),in_stack_fffffffffffff008
             ,chainstate_00);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78));
  std::make_shared<CBlock,CBlock_const&>(in_stack_ffffffffffffef98);
  std::shared_ptr<CBlock_const>::operator=
            ((shared_ptr<const_CBlock> *)
             CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
             (shared_ptr<CBlock> *)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70));
  std::shared_ptr<CBlock>::~shared_ptr((shared_ptr<CBlock> *)in_stack_ffffffffffffef68);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffef68);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffefaf,in_stack_ffffffffffffefa8),
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
             (char *)in_stack_ffffffffffffef98,
             (char *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90),
             (int)((ulong)in_stack_ffffffffffffef88 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffef88 >> 0x18,0));
  BlockValidationState::BlockValidationState((BlockValidationState *)in_stack_ffffffffffffef68);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefaf,in_stack_ffffffffffffefa8),
               (const_string *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
               (size_t)in_stack_ffffffffffffef98,
               (const_string *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90));
    CChainParams::GetConsensus((CChainParams *)in_stack_ffffffffffffef68);
    uVar5 = CheckBlock((CBlock *)CONCAT17(uVar3,in_stack_fffffffffffff088),
                       (BlockValidationState *)state_00,
                       (Params *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                       SUB81((ulong)plVar7 >> 0x38,0),SUB81((ulong)plVar7 >> 0x30,0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               SUB41((uint)in_stack_ffffffffffffef74 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    in_stack_ffffffffffffef68 = (CoinStatsIndex *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_cf0,local_d10,local_d30,100,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef68);
    bVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefaf,in_stack_ffffffffffffefa8),
               (const_string *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
               (size_t)in_stack_ffffffffffffef98,
               (const_string *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90));
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffef68);
    in_stack_ffffffffffffef70 = 1;
    v = (basic_cstring<const_char> *)0x0;
    ChainstateManager::AcceptBlock
              (pCVar8,(shared_ptr<const_CBlock> *)CONCAT17(uVar2,in_stack_fffffffffffff098),
               (BlockValidationState *)plVar6,
               (CBlockIndex **)CONCAT17(uVar3,in_stack_fffffffffffff088),
               SUB81((ulong)state_00 >> 0x38,0),
               (FlatFilePos *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
               in_stack_fffffffffffff1d0,SUB81((ulong)plVar7 >> 0x38,0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               SUB41((uint)in_stack_ffffffffffffef74 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)v);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),v);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)v);
    in_stack_ffffffffffffef68 = (CoinStatsIndex *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d68,local_d88,local_da8,0x65,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef68);
    bVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar4);
  Chainstate::CoinsTip(in_stack_ffffffffffffef88);
  CCoinsViewCache::CCoinsViewCache
            (in_stack_ffffffffffffefb8,
             (CCoinsView *)CONCAT17(in_stack_ffffffffffffefb7,in_stack_ffffffffffffefb0),
             (bool)in_stack_ffffffffffffefaf);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefaf,in_stack_ffffffffffffefa8),
               (const_string *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
               (size_t)in_stack_ffffffffffffef98,
               (const_string *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90));
    Chainstate::ConnectBlock
              ((Chainstate *)index_1.super_BaseIndex.m_thread_sync._M_id._M_thread,
               (CBlock *)index_1.super_BaseIndex.m_best_block_index._M_b._M_p,
               (BlockValidationState *)index_1.super_BaseIndex._8_8_,
               (CBlockIndex *)view.m_cache_coins_memory_resource.m_free_lists._M_elems[2],
               (CCoinsViewCache *)
               index_1.super_BaseIndex.super_CValidationInterface._vptr_CValidationInterface,
               (bool)criticalblock15.super_unique_lock._15_1_);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               SUB41((uint)in_stack_ffffffffffffef74 >> 0x18,0));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    in_stack_ffffffffffffef68 = (CoinStatsIndex *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_de0,local_e00,local_e20,0x67,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef68);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)in_stack_ffffffffffffef68);
  BlockValidationState::~BlockValidationState((BlockValidationState *)in_stack_ffffffffffffef68);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffef68);
  CBlock::~CBlock((CBlock *)in_stack_ffffffffffffef68);
  CScript::~CScript((CScript *)in_stack_ffffffffffffef68);
  ValidationInterfaceTest::BlockConnected
            (in_stack_ffffffffffffef7c,
             (CValidationInterface *)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
             (shared_ptr<const_CBlock> *)in_stack_ffffffffffffef68,(CBlockIndex *)0x54ea45);
  BaseIndex::Stop(&in_stack_ffffffffffffef68->super_BaseIndex);
  std::shared_ptr<const_CBlock>::~shared_ptr((shared_ptr<const_CBlock> *)in_stack_ffffffffffffef68);
  CoinStatsIndex::~CoinStatsIndex(in_stack_ffffffffffffef68);
  interfaces::MakeChain
            ((NodeContext *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78));
  CoinStatsIndex::CoinStatsIndex
            ((CoinStatsIndex *)CONCAT17(in_stack_ffffffffffffefaf,in_stack_ffffffffffffefa8),
             (unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),(size_t)plVar6,
             (bool)uVar2,(bool)in_stack_ffffffffffffefce);
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::~unique_ptr
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefaf,in_stack_ffffffffffffefa8),
               (const_string *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
               (size_t)in_stack_ffffffffffffef98,
               (const_string *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90));
    BaseIndex::Init((BaseIndex *)CONCAT17(uVar5,in_stack_fffffffffffff020));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               SUB41((uint)in_stack_ffffffffffffef74 >> 0x18,0));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    in_stack_ffffffffffffefa8 = SUB87(plVar6,0);
    in_stack_ffffffffffffefaf = (undefined1)((ulong)plVar6 >> 0x38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    in_stack_ffffffffffffef68 = (CoinStatsIndex *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e60,local_e80,local_ea0,0x72,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef68);
    in_stack_ffffffffffffefa7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffefa7);
  do {
    pCVar8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefaf,in_stack_ffffffffffffefa8),
               (const_string *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
               (size_t)pCVar8,
               (const_string *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90));
    in_stack_ffffffffffffef97 =
         BaseIndex::StartBackgroundSync
                   ((BaseIndex *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               SUB41((uint)in_stack_ffffffffffffef74 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
               (pointer)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
               (unsigned_long)in_stack_ffffffffffffef68);
    in_stack_ffffffffffffef68 = (CoinStatsIndex *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ed8,local_ef8,&local_f18,0x74,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef68);
    bVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar4);
  BaseIndex::Stop(&in_stack_ffffffffffffef68->super_BaseIndex);
  CoinStatsIndex::~CoinStatsIndex(in_stack_ffffffffffffef68);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(coinstatsindex_unclean_shutdown, TestChain100Setup)
{
    Chainstate& chainstate = Assert(m_node.chainman)->ActiveChainstate();
    const CChainParams& params = Params();
    {
        CoinStatsIndex index{interfaces::MakeChain(m_node), 1 << 20};
        BOOST_REQUIRE(index.Init());
        BOOST_REQUIRE(index.StartBackgroundSync());
        IndexWaitSynced(index, *Assert(m_node.shutdown));
        std::shared_ptr<const CBlock> new_block;
        CBlockIndex* new_block_index = nullptr;
        {
            const CScript script_pub_key{CScript() << ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG};
            const CBlock block = this->CreateBlock({}, script_pub_key, chainstate);

            new_block = std::make_shared<CBlock>(block);

            LOCK(cs_main);
            BlockValidationState state;
            BOOST_CHECK(CheckBlock(block, state, params.GetConsensus()));
            BOOST_CHECK(m_node.chainman->AcceptBlock(new_block, state, &new_block_index, true, nullptr, nullptr, true));
            CCoinsViewCache view(&chainstate.CoinsTip());
            BOOST_CHECK(chainstate.ConnectBlock(block, state, new_block_index, view));
        }
        // Send block connected notification, then stop the index without
        // sending a chainstate flushed notification. Prior to #24138, this
        // would cause the index to be corrupted and fail to reload.
        ValidationInterfaceTest::BlockConnected(ChainstateRole::NORMAL, index, new_block, new_block_index);
        index.Stop();
    }

    {
        CoinStatsIndex index{interfaces::MakeChain(m_node), 1 << 20};
        BOOST_REQUIRE(index.Init());
        // Make sure the index can be loaded.
        BOOST_REQUIRE(index.StartBackgroundSync());
        index.Stop();
    }
}